

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicSSOComputePipeline::Run(BasicSSOComputePipeline *this)

{
  bool bVar1;
  GLuint GVar2;
  int w;
  int h;
  Vector<float,_4> local_c4;
  allocator<char> local_b1;
  string local_b0;
  char *local_90;
  char *glsl_fs;
  string local_80;
  char *local_60;
  char *glsl_vs;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  BasicSSOComputePipeline *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 4) in;\nlayout(std430) buffer Output {\n  vec4 g_output[4];\n};\nvoid main() {\n  const vec2 quad[4] = { vec2(-1, -1), vec2(1, -1), vec2(-1, 1), vec2(1, 1) };\n  g_output[gl_GlobalInvocationID.x] = vec4(quad[gl_GlobalInvocationID.x], 0, 1);\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 4) in;\nlayout(std430) buffer Output {\n  vec4 g_output[4];\n};\nvoid main() {\n  const vec2 quad[4] = { vec2(-1, -1), vec2(1, -1), vec2(-1, 1), vec2(1, 1) };\n  g_output[gl_GlobalInvocationID.x] = vec4(quad[gl_GlobalInvocationID.x], 0, 1);\n}"
             ,&local_41);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
  this->m_csp = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glProgramParameteri
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_csp,0x8258,1);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_csp);
  bVar1 = ComputeShaderBase::CheckProgram(&this->super_ComputeShaderBase,this->m_csp,(bool *)0x0);
  if (bVar1) {
    local_60 = 
    "\nlayout(location = 0) in vec4 i_position;\nout gl_PerVertex {\n  vec4 gl_Position;\n};\nvoid main() {\n  gl_Position = i_position;\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "\nlayout(location = 0) in vec4 i_position;\nout gl_PerVertex {\n  vec4 gl_Position;\n};\nvoid main() {\n  gl_Position = i_position;\n}"
               ,(allocator<char> *)((long)&glsl_fs + 7));
    GVar2 = ComputeShaderBase::BuildShaderProgram(&this->super_ComputeShaderBase,0x8b31,&local_80);
    this->m_vsp = GVar2;
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&glsl_fs + 7));
    bVar1 = ComputeShaderBase::CheckProgram(&this->super_ComputeShaderBase,this->m_vsp,(bool *)0x0);
    if (bVar1) {
      local_90 = 
      "\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0, 1, 0, 1);\n}";
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,
                 "\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0, 1, 0, 1);\n}"
                 ,&local_b1);
      GVar2 = ComputeShaderBase::BuildShaderProgram(&this->super_ComputeShaderBase,0x8b30,&local_b0)
      ;
      this->m_fsp = GVar2;
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      bVar1 = ComputeShaderBase::CheckProgram
                        (&this->super_ComputeShaderBase,this->m_fsp,(bool *)0x0);
      if (bVar1) {
        glu::CallLogWrapper::glGenProgramPipelines
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_pipeline);
        glu::CallLogWrapper::glUseProgramStages
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_pipeline,1,this->m_vsp);
        glu::CallLogWrapper::glUseProgramStages
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_pipeline,2,this->m_fsp);
        glu::CallLogWrapper::glUseProgramStages
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_pipeline,0x20,this->m_csp);
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_storage_buffer);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,this->m_storage_buffer);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0x40,(void *)0x0,0x88e8);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0);
        glu::CallLogWrapper::glGenVertexArrays
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_vertex_array);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_vertex_array);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,this->m_storage_buffer);
        glu::CallLogWrapper::glVertexAttribPointer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,4,0x1406,'\0',0,(void *)0x0);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        glu::CallLogWrapper::glBindProgramPipeline
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_pipeline);
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0,this->m_storage_buffer);
        glu::CallLogWrapper::glDispatchCompute
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,1,1);
        glu::CallLogWrapper::glClear
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x4000);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_vertex_array);
        glu::CallLogWrapper::glMemoryBarrier
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1);
        glu::CallLogWrapper::glDrawArrays
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5,0,4);
        w = ComputeShaderBase::getWindowWidth(&this->super_ComputeShaderBase);
        h = ComputeShaderBase::getWindowHeight(&this->super_ComputeShaderBase);
        tcu::Vector<float,_4>::Vector(&local_c4,0.0,1.0,0.0,1.0);
        bVar1 = ComputeShaderBase::ValidateReadBuffer
                          (&this->super_ComputeShaderBase,0,0,w,h,&local_c4);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          this_local = (BasicSSOComputePipeline *)0x0;
        }
        else {
          this_local = (BasicSSOComputePipeline *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicSSOComputePipeline *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicSSOComputePipeline *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicSSOComputePipeline *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "layout(std430) buffer Output {" NL "  vec4 g_output[4];" NL "};" NL
			   "void main() {" NL "  const vec2 quad[4] = { vec2(-1, -1), vec2(1, -1), vec2(-1, 1), vec2(1, 1) };" NL
			   "  g_output[gl_GlobalInvocationID.x] = vec4(quad[gl_GlobalInvocationID.x], 0, 1);" NL "}";

		m_csp = CreateComputeProgram(glsl_cs);
		glProgramParameteri(m_csp, GL_PROGRAM_SEPARABLE, GL_TRUE);
		glLinkProgram(m_csp);
		if (!CheckProgram(m_csp))
			return ERROR;

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL
			   "void main() {" NL "  gl_Position = i_position;" NL "}";
		m_vsp = BuildShaderProgram(GL_VERTEX_SHADER, glsl_vs);
		if (!CheckProgram(m_vsp))
			return ERROR;

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 o_color;" NL "void main() {" NL "  o_color = vec4(0, 1, 0, 1);" NL "}";
		m_fsp = BuildShaderProgram(GL_FRAGMENT_SHADER, glsl_fs);
		if (!CheckProgram(m_fsp))
			return ERROR;

		glGenProgramPipelines(1, &m_pipeline);
		glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_vsp);
		glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_fsp);
		glUseProgramStages(m_pipeline, GL_COMPUTE_SHADER_BIT, m_csp);

		glGenBuffers(1, &m_storage_buffer);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * 4, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_storage_buffer);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glBindProgramPipeline(m_pipeline);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glDispatchCompute(1, 1, 1);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindVertexArray(m_vertex_array);
		glMemoryBarrier(GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
			return ERROR;
		return NO_ERROR;
	}